

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageQualifiersTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::image::anon_unknown_0::MemoryQualifierInstanceBase::iterate
          (TestStatus *__return_storage_ptr__,MemoryQualifierInstanceBase *this)

{
  TextureFormat *format;
  TestContext *pTVar1;
  TestLog *log;
  ulong uVar2;
  char *imageSetDesc;
  char *imageSetName;
  bool bVar3;
  deUint32 dVar4;
  deUint32 dVar5;
  int iVar6;
  VkFormat VVar7;
  VkDevice device;
  DeviceInterface *deviceInterface;
  ProgramBinary *binary;
  deInt32 z;
  uint uVar8;
  ImageType IVar9;
  deInt32 y;
  uint y_00;
  deInt32 x;
  uint x_00;
  int s;
  MemoryQualifierInstanceBase *pMVar10;
  ulong uVar11;
  long lVar12;
  int iVar13;
  uint local_2d4;
  uint local_2d0;
  deUint32 local_2cc;
  VkQueue local_2c8;
  uint local_2bc;
  UVec3 *local_2b8;
  MemoryQualifierInstanceBase *local_2b0;
  UVec3 computeGridSize_1;
  UVec3 localWorkGroupSize;
  int local_264;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_260 [2];
  uint local_240;
  uint local_23c;
  RefBase<vk::VkCommandBuffer_s_*> local_238;
  UVec3 localWorkGroupSize_1;
  UVec3 computeGridSize;
  UVec3 numGroups;
  UVec3 computeGridSize_2;
  string comparisonName;
  RefBase<vk::Handle<(vk::HandleType)16>_> local_198;
  ConstPixelBufferAccess referencePixelBuffer;
  RefBase<vk::Handle<(vk::HandleType)24>_> local_148;
  RefBase<vk::Handle<(vk::HandleType)18>_> local_128;
  RefBase<vk::Handle<(vk::HandleType)14>_> local_108;
  TextureLevel referenceImage;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string local_98;
  string local_78;
  ConstPixelBufferAccess resultPixelBuffer;
  
  device = Context::getDevice((this->super_TestInstance).m_context);
  deviceInterface = Context::getDeviceInterface((this->super_TestInstance).m_context);
  local_2c8 = Context::getUniversalQueue((this->super_TestInstance).m_context);
  dVar4 = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  local_2b8 = &this->m_imageSize;
  dVar5 = getNumPixels(this->m_imageType,local_2b8);
  iVar6 = tcu::getPixelSize(this->m_format);
  uVar11 = (ulong)(iVar6 * dVar5);
  (*(this->super_TestInstance)._vptr_TestInstance[3])(this,uVar11);
  (*(this->super_TestInstance)._vptr_TestInstance[4])(this);
  binary = ::vk::ProgramCollection<vk::ProgramBinary>::get
                     (((this->super_TestInstance).m_context)->m_progCollection,&this->m_name);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)&computeGridSize_1,deviceInterface,device,
             binary,0);
  local_108.m_data.object.m_internal._0_4_ = computeGridSize_1.m_data[0];
  local_108.m_data.object.m_internal._4_4_ = computeGridSize_1.m_data[1];
  local_108.m_data.deleter.m_deviceIface = stack0xfffffffffffffd60;
  computeGridSize_1.m_data[0] = 0;
  computeGridSize_1.m_data[1] = 0;
  stack0xfffffffffffffd60 = (DeviceInterface *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)14>_> *)&computeGridSize_1);
  local_2b0 = this;
  makePipelineLayout((Move<vk::Handle<(vk::HandleType)16>_> *)&computeGridSize_1,deviceInterface,
                     device,(VkDescriptorSetLayout)
                            (this->m_descriptorSetLayout).
                            super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.m_internal)
  ;
  local_198.m_data.deleter.m_device = (VkDevice)0x0;
  local_198.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  local_198.m_data.object.m_internal._0_4_ = computeGridSize_1.m_data[0];
  local_198.m_data.object.m_internal._4_4_ = computeGridSize_1.m_data[1];
  local_198.m_data.deleter.m_deviceIface = stack0xfffffffffffffd60;
  computeGridSize_1.m_data[0] = 0;
  computeGridSize_1.m_data[1] = 0;
  stack0xfffffffffffffd60 = (DeviceInterface *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)16>_> *)&computeGridSize_1);
  makeComputePipeline((Move<vk::Handle<(vk::HandleType)18>_> *)&computeGridSize_1,deviceInterface,
                      device,(VkPipelineLayout)local_198.m_data.object.m_internal,
                      (VkShaderModule)local_108.m_data.object.m_internal);
  local_128.m_data.deleter.m_device = (VkDevice)0x0;
  local_128.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  local_128.m_data.object.m_internal._0_4_ = computeGridSize_1.m_data[0];
  local_128.m_data.object.m_internal._4_4_ = computeGridSize_1.m_data[1];
  local_128.m_data.deleter.m_deviceIface = stack0xfffffffffffffd60;
  computeGridSize_1.m_data[0] = 0;
  computeGridSize_1.m_data[1] = 0;
  stack0xfffffffffffffd60 = (DeviceInterface *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)18>_> *)&computeGridSize_1);
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)&computeGridSize_1,deviceInterface,device,2,
             dVar4,(VkAllocationCallbacks *)0x0);
  local_148.m_data.deleter.m_device = (VkDevice)0x0;
  local_148.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  local_148.m_data.object.m_internal._0_4_ = computeGridSize_1.m_data[0];
  local_148.m_data.object.m_internal._4_4_ = computeGridSize_1.m_data[1];
  local_148.m_data.deleter.m_deviceIface = stack0xfffffffffffffd60;
  computeGridSize_1.m_data[0] = 0;
  computeGridSize_1.m_data[1] = 0;
  stack0xfffffffffffffd60 = (DeviceInterface *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)24>_> *)&computeGridSize_1);
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)&computeGridSize_1,deviceInterface,device,
             (VkCommandPool)local_148.m_data.object.m_internal,VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  local_238.m_data.deleter.m_device = (VkDevice)0x0;
  local_238.m_data.deleter.m_pool.m_internal = 0;
  local_238.m_data.object = (VkCommandBuffer_s *)computeGridSize_1.m_data._0_8_;
  local_238.m_data.deleter.m_deviceIface = stack0xfffffffffffffd60;
  computeGridSize_1.m_data[0] = 0;
  computeGridSize_1.m_data[1] = 0;
  stack0xfffffffffffffd60 = (DeviceInterface *)0x0;
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase
            ((RefBase<vk::VkCommandBuffer_s_*> *)&computeGridSize_1);
  beginCommandBuffer(deviceInterface,local_238.m_data.object);
  (*deviceInterface->_vptr_DeviceInterface[0x4c])
            (deviceInterface,local_238.m_data.object,1,local_128.m_data.object.m_internal);
  (*deviceInterface->_vptr_DeviceInterface[0x56])
            (deviceInterface,local_238.m_data.object,1,local_198.m_data.object.m_internal,0,1,
             &local_2b0->m_descriptorSet,0,0);
  (*(local_2b0->super_TestInstance)._vptr_TestInstance[5])(local_2b0,local_238.m_data.object,uVar11)
  ;
  IVar9 = local_2b0->m_imageType;
  getShaderGridSize((image *)&computeGridSize_1,IVar9,local_2b8);
  getLocalWorkGroupSize((anon_unknown_0 *)&localWorkGroupSize,IVar9,local_2b8);
  tcu::operator/((tcu *)&numGroups,&computeGridSize_1,&localWorkGroupSize);
  (*deviceInterface->_vptr_DeviceInterface[0x5d])
            (deviceInterface,local_238.m_data.object,(ulong)numGroups.m_data[0],
             (ulong)numGroups.m_data[1],(ulong)numGroups.m_data[2]);
  (*(local_2b0->super_TestInstance)._vptr_TestInstance[6])(local_2b0,local_238.m_data.object,uVar11)
  ;
  endCommandBuffer(deviceInterface,local_238.m_data.object);
  submitCommandsAndWait(deviceInterface,device,local_2c8,local_238.m_data.object);
  pMVar10 = local_2b0;
  lVar12 = (long)(((local_2b0->m_buffer).
                   super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>.
                   m_data.ptr)->m_allocation).
                 super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  ::vk::invalidateMappedMemoryRange
            (deviceInterface,device,(VkDeviceMemory)*(deUint64 *)(lVar12 + 8),
             *(VkDeviceSize *)(lVar12 + 0x10),uVar11);
  getShaderGridSize((image *)&computeGridSize,pMVar10->m_imageType,local_2b8);
  format = &pMVar10->m_format;
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            (&resultPixelBuffer,format,computeGridSize.m_data[0],computeGridSize.m_data[1],
             computeGridSize.m_data[2],*(void **)(lVar12 + 0x18));
  getShaderGridSize((image *)&computeGridSize_2,pMVar10->m_imageType,local_2b8);
  tcu::TextureLevel::TextureLevel
            ((TextureLevel *)&computeGridSize_1,format,computeGridSize_2.m_data[0],
             computeGridSize_2.m_data[1],computeGridSize_2.m_data[2]);
  tcu::TextureLevel::getAccess
            ((PixelBufferAccess *)&localWorkGroupSize,(TextureLevel *)&computeGridSize_1);
  tcu::TextureLevel::TextureLevel
            (&referenceImage,format,computeGridSize_2.m_data[0],computeGridSize_2.m_data[1],
             computeGridSize_2.m_data[2]);
  tcu::TextureLevel::getAccess((PixelBufferAccess *)&referencePixelBuffer,&referenceImage);
  for (uVar8 = 0; (int)uVar8 < (int)local_260[0]._0_4_; uVar8 = uVar8 + 1) {
    for (y_00 = 0; (int)y_00 < local_264; y_00 = y_00 + 1) {
      for (x_00 = 0; (int)x_00 < (int)localWorkGroupSize.m_data[2]; x_00 = x_00 + 1) {
        tcu::Vector<int,_4>::Vector((Vector<int,_4> *)&comparisonName,y_00 ^ uVar8 ^ x_00);
        tcu::PixelBufferAccess::setPixel
                  ((PixelBufferAccess *)&localWorkGroupSize,(IVec4 *)&comparisonName,x_00,y_00,uVar8
                  );
      }
      pMVar10 = local_2b0;
    }
  }
  getLocalWorkGroupSize((anon_unknown_0 *)&localWorkGroupSize_1,pMVar10->m_imageType,local_2b8);
  local_2d0 = localWorkGroupSize_1.m_data[0];
  local_2bc = localWorkGroupSize_1.m_data[1];
  for (iVar6 = 0; iVar6 < referencePixelBuffer.m_size.m_data[2]; iVar6 = iVar6 + 1) {
    for (dVar4 = 0; (int)dVar4 < referencePixelBuffer.m_size.m_data[1]; dVar4 = dVar4 + 1) {
      uVar11 = 0;
      local_2cc = dVar4;
      while (iVar13 = (int)uVar11, iVar13 < referencePixelBuffer.m_size.m_data[0]) {
        uVar2 = (ulong)local_2d0;
        local_2c8 = (VkQueue)CONCAT44(local_2c8._4_4_,iVar13);
        uVar8 = dVar4 % local_2bc;
        s = 0;
        for (lVar12 = 0; lVar12 != 0x10; lVar12 = lVar12 + 4) {
          tcu::ConstPixelBufferAccess::getPixelInt
                    ((ConstPixelBufferAccess *)&comparisonName,(int)&localWorkGroupSize,
                     (uint)(*(int *)((long)&image::(anonymous_namespace)::g_ShaderReadOffsetsX +
                                    lVar12) + (int)local_2c8) % local_2d0 +
                     (iVar13 - (int)(uVar11 % uVar2)),
                     (*(int *)((long)&image::(anonymous_namespace)::g_ShaderReadOffsetsY + lVar12) +
                     local_2cc) % local_2bc + (dVar4 - uVar8));
          s = s + (int)comparisonName._M_dataplus._M_p;
        }
        tcu::Vector<int,_4>::Vector((Vector<int,_4> *)&comparisonName,s);
        dVar4 = local_2cc;
        iVar13 = (int)local_2c8;
        tcu::PixelBufferAccess::setPixel
                  ((PixelBufferAccess *)&referencePixelBuffer,(IVec4 *)&comparisonName,
                   (int)local_2c8,local_2cc,iVar6);
        uVar11 = (ulong)(iVar13 + 1);
      }
      pMVar10 = local_2b0;
    }
  }
  tcu::TextureLevel::~TextureLevel((TextureLevel *)&computeGridSize_1);
  tcu::TextureLevel::getAccess((PixelBufferAccess *)&computeGridSize_1,&referenceImage);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            (&referencePixelBuffer,(ConstPixelBufferAccess *)&computeGridSize_1);
  pTVar1 = ((pMVar10->super_TestInstance).m_context)->m_testCtx;
  IVar9 = pMVar10->m_imageType;
  VVar7 = ::vk::mapTextureFormat(format);
  bVar3 = ::vk::isIntFormat(VVar7);
  local_2d0._0_1_ = true;
  if (!bVar3) {
    VVar7 = ::vk::mapTextureFormat(format);
    local_2d0._0_1_ = ::vk::isUintFormat(VVar7);
  }
  uVar8 = 0;
  local_2bc = IVar9 - IMAGE_TYPE_CUBE;
  local_2cc = 0;
  local_2c8 = (VkQueue)(ulong)IVar9;
  while( true ) {
    local_2d4 = uVar8;
    dVar4 = getNumLayers((ImageType)local_2c8,local_2b8);
    if (dVar4 <= uVar8) break;
    de::toString<unsigned_int>((string *)&computeGridSize_1,&local_2d4);
    std::operator+(&comparisonName,"Comparison",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &computeGridSize_1);
    std::__cxx11::string::~string((string *)&computeGridSize_1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&computeGridSize_2,"Image Comparison, ",
               (allocator<char> *)&computeGridSize_1);
    if (local_2bc < 2) {
      std::operator+(&local_b8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &computeGridSize_2,"face ");
      local_23c = local_2d4 % 6;
      de::toString<unsigned_int>(&local_98,&local_23c);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &localWorkGroupSize_1,&local_b8,&local_98);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &localWorkGroupSize,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &localWorkGroupSize_1,", cube ");
      local_240 = local_2d4 / 6;
      de::toString<unsigned_int>(&local_78,&local_240);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &computeGridSize_1,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &localWorkGroupSize,&local_78);
      std::__cxx11::string::operator=((string *)&computeGridSize_2,(string *)&computeGridSize_1);
      std::__cxx11::string::~string((string *)&computeGridSize_1);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&localWorkGroupSize);
      std::__cxx11::string::~string((string *)&localWorkGroupSize_1);
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::~string((string *)&local_b8);
    }
    else {
      if ((int)local_2c8 == 4) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &localWorkGroupSize,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &computeGridSize_2,"slice ");
        de::toString<unsigned_int>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &localWorkGroupSize_1,&local_2d4);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &computeGridSize_1,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &localWorkGroupSize,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &localWorkGroupSize_1);
      }
      else {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &localWorkGroupSize,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &computeGridSize_2,"layer ");
        de::toString<unsigned_int>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &localWorkGroupSize_1,&local_2d4);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &computeGridSize_1,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &localWorkGroupSize,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &localWorkGroupSize_1);
      }
      std::__cxx11::string::operator=((string *)&computeGridSize_2,(string *)&computeGridSize_1);
      std::__cxx11::string::~string((string *)&computeGridSize_1);
      std::__cxx11::string::~string((string *)&localWorkGroupSize_1);
      std::__cxx11::string::~string((string *)&localWorkGroupSize);
    }
    IVar9 = (ImageType)local_2c8;
    getLayerOrSlice((ConstPixelBufferAccess *)&computeGridSize_1,IVar9,&referencePixelBuffer,
                    local_2d4);
    getLayerOrSlice((ConstPixelBufferAccess *)&localWorkGroupSize,IVar9,&resultPixelBuffer,local_2d4
                   );
    log = pTVar1->m_log;
    imageSetName = (char *)CONCAT44(comparisonName._M_dataplus._M_p._4_4_,
                                    (int)comparisonName._M_dataplus._M_p);
    imageSetDesc = (char *)CONCAT44(computeGridSize_2.m_data[1],computeGridSize_2.m_data[0]);
    if ((char)local_2d0 == '\0') {
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&localWorkGroupSize_1,0.01);
      bVar3 = tcu::floatThresholdCompare
                        (log,imageSetName,imageSetDesc,(ConstPixelBufferAccess *)&computeGridSize_1,
                         (ConstPixelBufferAccess *)&localWorkGroupSize,(Vec4 *)&localWorkGroupSize_1
                         ,COMPARE_LOG_RESULT);
    }
    else {
      tcu::Vector<unsigned_int,_4>::Vector((Vector<unsigned_int,_4> *)&localWorkGroupSize_1,0);
      bVar3 = tcu::intThresholdCompare
                        (log,imageSetName,imageSetDesc,(ConstPixelBufferAccess *)&computeGridSize_1,
                         (ConstPixelBufferAccess *)&localWorkGroupSize,
                         (UVec4 *)&localWorkGroupSize_1,COMPARE_LOG_RESULT);
    }
    local_2cc = local_2cc + bVar3;
    std::__cxx11::string::~string((string *)&computeGridSize_2);
    std::__cxx11::string::~string((string *)&comparisonName);
    uVar8 = local_2d4 + 1;
  }
  dVar4 = getNumLayers((ImageType)local_2c8,local_2b8);
  if (local_2cc == dVar4) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&computeGridSize_1,"Passed",(allocator<char> *)&localWorkGroupSize);
    tcu::TestStatus::pass(__return_storage_ptr__,(string *)&computeGridSize_1);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&computeGridSize_1,"Image comparison failed",
               (allocator<char> *)&localWorkGroupSize);
    tcu::TestStatus::fail(__return_storage_ptr__,(string *)&computeGridSize_1);
  }
  std::__cxx11::string::~string((string *)&computeGridSize_1);
  tcu::TextureLevel::~TextureLevel(&referenceImage);
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase(&local_238);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase(&local_148);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase(&local_128);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::~RefBase(&local_198);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase(&local_108);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus	MemoryQualifierInstanceBase::iterate (void)
{
	const VkDevice			device				= m_context.getDevice();
	const DeviceInterface&	deviceInterface		= m_context.getDeviceInterface();
	const VkQueue			queue				= m_context.getUniversalQueue();
	const deUint32			queueFamilyIndex	= m_context.getUniversalQueueFamilyIndex();

	const VkDeviceSize	bufferSizeInBytes = getNumPixels(m_imageType, m_imageSize) * tcu::getPixelSize(m_format);

	// Prepare resources for the test
	prepareResources(bufferSizeInBytes);

	// Prepare descriptor sets
	prepareDescriptors();

	// Create compute shader
	const vk::Unique<VkShaderModule> shaderModule(createShaderModule(deviceInterface, device, m_context.getBinaryCollection().get(m_name), 0u));

	// Create compute pipeline
	const vk::Unique<VkPipelineLayout> pipelineLayout(makePipelineLayout(deviceInterface, device, *m_descriptorSetLayout));
	const vk::Unique<VkPipeline> pipeline(makeComputePipeline(deviceInterface, device, *pipelineLayout, *shaderModule));

	// Create command buffer
	const Unique<VkCommandPool> cmdPool(createCommandPool(deviceInterface, device, VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT, queueFamilyIndex));
	const Unique<VkCommandBuffer> cmdBuffer(allocateCommandBuffer(deviceInterface, device, *cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY));

	// Start recording commands
	beginCommandBuffer(deviceInterface, *cmdBuffer);

	deviceInterface.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *pipeline);
	deviceInterface.cmdBindDescriptorSets(*cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *pipelineLayout, 0u, 1u, &m_descriptorSet.get(), 0u, DE_NULL);

	commandsBeforeCompute(*cmdBuffer, bufferSizeInBytes);

	const tcu::UVec3 numGroups = getNumWorkGroups(m_imageType, m_imageSize);
	deviceInterface.cmdDispatch(*cmdBuffer, numGroups.x(), numGroups.y(), numGroups.z());

	commandsAfterCompute(*cmdBuffer, bufferSizeInBytes);

	endCommandBuffer(deviceInterface, *cmdBuffer);

	// Submit and wait for completion
	submitCommandsAndWait(deviceInterface, device, queue, *cmdBuffer);

	// Retrieve data from buffer to host memory
	const Allocation& allocation = m_buffer->getAllocation();
	invalidateMappedMemoryRange(deviceInterface, device, allocation.getMemory(), allocation.getOffset(), bufferSizeInBytes);

	const tcu::UVec3 computeGridSize = getShaderGridSize(m_imageType, m_imageSize);
	tcu::ConstPixelBufferAccess resultPixelBuffer(m_format, computeGridSize.x(), computeGridSize.y(), computeGridSize.z(), allocation.getHostPtr());

	// Create a reference image
	tcu::TextureLevel referenceImage = generateReferenceImage();
	tcu::ConstPixelBufferAccess referencePixelBuffer = referenceImage.getAccess();

	// Validate the result
	if (comparePixelBuffers(m_context.getTestContext(), m_imageType, m_imageSize, m_format, referencePixelBuffer, resultPixelBuffer))
		return tcu::TestStatus::pass("Passed");
	else
		return tcu::TestStatus::fail("Image comparison failed");
}